

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O0

int Sbd_ManCutIsTopo(Gia_Man_t *p,Vec_Int_t *vMirrors,Vec_Int_t *vCut,int iObj)

{
  int iVar1;
  int RetValue;
  int Entry;
  int i;
  int iObj_local;
  Vec_Int_t *vCut_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *p_local;
  
  Gia_ManIncrementTravId(p);
  for (RetValue = 0; iVar1 = Vec_IntSize(vCut), RetValue < iVar1; RetValue = RetValue + 1) {
    iVar1 = Vec_IntEntry(vCut,RetValue);
    Gia_ObjSetTravIdCurrentId(p,iVar1);
  }
  iVar1 = Sbd_ManCutIsTopo_rec(p,vMirrors,iObj);
  if (iVar1 != 0) {
    return iVar1;
  }
  printf("Cut of node %d is not tological\n",(ulong)(uint)iObj);
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                ,0x9c,"int Sbd_ManCutIsTopo(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
}

Assistant:

int Sbd_ManCutIsTopo( Gia_Man_t * p, Vec_Int_t * vMirrors, Vec_Int_t * vCut, int iObj )
{
    int i, Entry, RetValue;
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vCut, Entry, i )
        Gia_ObjSetTravIdCurrentId( p, Entry );        
    RetValue = Sbd_ManCutIsTopo_rec( p, vMirrors, iObj );
    if ( RetValue == 0 )
        printf( "Cut of node %d is not tological\n", iObj );
    assert( RetValue );
    return RetValue;
}